

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O1

gc_heap_ptr_untyped ** mjs::gc_heap::pointer_set::alloc(uint32_t cap)

{
  gc_heap_ptr_untyped **ppgVar1;
  undefined8 *puVar2;
  
  ppgVar1 = (gc_heap_ptr_untyped **)malloc((ulong)cap << 3);
  if (ppgVar1 != (gc_heap_ptr_untyped **)0x0) {
    return ppgVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::__cxx11::wstring::find;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static gc_heap_ptr_untyped** alloc(uint32_t cap) {
            auto p = std::malloc(sizeof(gc_heap_ptr_untyped*) * cap);
            if (!p) throw std::bad_alloc{};
            return static_cast<gc_heap_ptr_untyped**>(p);
        }